

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::EmitFieldNonDefaultCondition
               (Printer *printer,string *prefix,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *other;
  OneofDescriptor *pOVar3;
  FieldDescriptor *field_00;
  char *format_00;
  allocator local_99;
  string local_98;
  Formatter format;
  string local_40;
  
  bVar1 = HasHasbit(field);
  if (bVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&format,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xdd);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&format,"CHECK failed: !HasHasbit(field): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,other);
    internal::LogMessage::~LogMessage((LogMessage *)&format);
  }
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &format.vars_._M_t._M_impl.super__Rb_tree_header._M_header;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  format.printer_ = printer;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_98,"prefix",(allocator *)&local_40);
  Formatter::Set<std::__cxx11::string>(&format,&local_98,prefix);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"name",&local_99);
  FieldName_abi_cxx11_(&local_40,(cpp *)field,field_00);
  Formatter::Set<std::__cxx11::string>(&format,&local_98,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_98);
  if (((~(byte)field[1] & 0x60) == 0) ||
     ((((byte)field[1] & 0x10) != 0 && (*(long *)(field + 0x28) != 0)))) {
    pOVar3 = FieldDescriptor::real_containing_oneof(field);
    if (pOVar3 == (OneofDescriptor *)0x0) {
      bVar1 = false;
      goto LAB_002df3fc;
    }
    format_00 = "if (_internal_has_$name$()) {\n";
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_STRING) {
      format_00 = "if (!$prefix$_internal_$name$().empty()) {\n";
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(field);
      if (CVar2 == CPPTYPE_MESSAGE) {
        format_00 = "if ($prefix$_internal_has_$name$()) {\n";
      }
      else {
        CVar2 = FieldDescriptor::cpp_type(field);
        if (CVar2 == CPPTYPE_FLOAT) {
          format_00 = 
          "static_assert(sizeof(uint32_t) == sizeof(float), \"Code assumes uint32_t and float are the same size.\");\nfloat tmp_$name$ = $prefix$_internal_$name$();\nuint32_t raw_$name$;\nmemcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\nif (raw_$name$ != 0) {\n"
          ;
        }
        else {
          CVar2 = FieldDescriptor::cpp_type(field);
          format_00 = "if ($prefix$_internal_$name$() != 0) {\n";
          if (CVar2 == CPPTYPE_DOUBLE) {
            format_00 = 
            "static_assert(sizeof(uint64_t) == sizeof(double), \"Code assumes uint64_t and double are the same size.\");\ndouble tmp_$name$ = $prefix$_internal_$name$();\nuint64_t raw_$name$;\nmemcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\nif (raw_$name$ != 0) {\n"
            ;
          }
        }
      }
    }
  }
  Formatter::operator()<>(&format,format_00);
  bVar1 = true;
  io::Printer::Indent(format.printer_);
LAB_002df3fc:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return bVar1;
}

Assistant:

bool EmitFieldNonDefaultCondition(io::Printer* printer,
                                  const std::string& prefix,
                                  const FieldDescriptor* field) {
  GOOGLE_CHECK(!HasHasbit(field));
  Formatter format(printer);
  format.Set("prefix", prefix);
  format.Set("name", FieldName(field));
  // Merge and serialize semantics: primitive fields are merged/serialized only
  // if non-zero (numeric) or non-empty (string).
  if (!field->is_repeated() && !field->containing_oneof()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      format("if (!$prefix$_internal_$name$().empty()) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // Message fields still have has_$name$() methods.
      format("if ($prefix$_internal_has_$name$()) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT) {
      format(
          "static_assert(sizeof(uint32_t) == sizeof(float), \"Code assumes "
          "uint32_t and float are the same size.\");\n"
          "float tmp_$name$ = $prefix$_internal_$name$();\n"
          "uint32_t raw_$name$;\n"
          "memcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\n"
          "if (raw_$name$ != 0) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE) {
      format(
          "static_assert(sizeof(uint64_t) == sizeof(double), \"Code assumes "
          "uint64_t and double are the same size.\");\n"
          "double tmp_$name$ = $prefix$_internal_$name$();\n"
          "uint64_t raw_$name$;\n"
          "memcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\n"
          "if (raw_$name$ != 0) {\n");
    } else {
      format("if ($prefix$_internal_$name$() != 0) {\n");
    }
    format.Indent();
    return true;
  } else if (field->real_containing_oneof()) {
    format("if (_internal_has_$name$()) {\n");
    format.Indent();
    return true;
  }
  return false;
}